

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

void luaX_init(lua_State *L)

{
  char *__s;
  size_t l;
  TString *pTVar1;
  lu_byte lVar2;
  long lVar3;
  
  lVar2 = '\x01';
  for (lVar3 = 0; lVar3 != 0xa8; lVar3 = lVar3 + 8) {
    __s = *(char **)((long)luaX_tokens + lVar3);
    l = strlen(__s);
    pTVar1 = luaS_newlstr(L,__s,l);
    (pTVar1->tsv).marked = (pTVar1->tsv).marked | 0x20;
    (pTVar1->tsv).reserved = lVar2;
    lVar2 = lVar2 + '\x01';
  }
  return;
}

Assistant:

void luaX_init (lua_State *L) {
  int i;
  for (i=0; i<NUM_RESERVED; i++) {
    TString *ts = luaS_new(L, luaX_tokens[i]);
    luaS_fix(ts);  /* reserved words are never collected */
    lua_assert(strlen(luaX_tokens[i])+1 <= TOKEN_LEN);
    ts->tsv.reserved = cast_byte(i+1);  /* reserved word */
  }
}